

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_h265e_vepu511.c
# Opt level: O2

MPP_RET hal_h265e_vepu511_prepare(void *hal)

{
  long lVar1;
  int buf_idx;
  
  lVar1 = *(long *)((long)hal + 0x3b0);
  if (((byte)hal_h265e_debug & 1) != 0) {
    _mpp_log_l(4,"hal_h265e_v511","enter %p\n","hal_h265e_vepu511_prepare",hal);
  }
  if ((*(byte *)(lVar1 + 8) & 5) != 0) {
    vepu511_h265_setup_hal_bufs((H265eV511HalContext *)hal);
    for (buf_idx = 0; buf_idx < *(int *)((long)hal + 0x3d8); buf_idx = buf_idx + 1) {
      hal_bufs_get_buf(*(HalBufs *)((long)hal + 0x400),buf_idx);
    }
    *(undefined4 *)(lVar1 + 8) = 0;
  }
  if (((byte)hal_h265e_debug & 1) != 0) {
    _mpp_log_l(4,"hal_h265e_v511","leave %p\n","hal_h265e_vepu511_prepare",hal);
  }
  return MPP_OK;
}

Assistant:

static MPP_RET hal_h265e_vepu511_prepare(void *hal)
{
    H265eV511HalContext *ctx = (H265eV511HalContext *)hal;
    MppEncPrepCfg *prep = &ctx->cfg->prep;

    hal_h265e_dbg_func("enter %p\n", hal);

    if (prep->change & (MPP_ENC_PREP_CFG_CHANGE_INPUT | MPP_ENC_PREP_CFG_CHANGE_FORMAT)) {
        RK_S32 i;

        // pre-alloc required buffers to reduce first frame delay
        vepu511_h265_setup_hal_bufs(ctx);
        for (i = 0; i < ctx->max_buf_cnt; i++)
            hal_bufs_get_buf(ctx->dpb_bufs, i);

        prep->change = 0;
    }

    hal_h265e_dbg_func("leave %p\n", hal);

    return MPP_OK;
}